

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsExport.cpp
# Opt level: O1

void __thiscall MasterObjectHolder::clearApp(MasterObjectHolder *this,int index)

{
  _Map_pointer ppuVar1;
  _Elt_pointer puVar2;
  AppObject *__ptr;
  unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_> *puVar3;
  unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_> *puVar4;
  ulong uVar5;
  _Map_pointer ppuVar6;
  unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_> *puVar7;
  ulong uVar8;
  default_delete<helics::AppObject> *this_00;
  ulong uVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  handle appList;
  unique_lock<std::mutex> local_30;
  
  uVar5 = (ulong)(uint)index;
  local_30._M_device = &(this->apps).m_mutex;
  local_30._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_30);
  local_30._M_owns = true;
  ppuVar1 = (this->apps).m_obj.
            super__Deque_base<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>,_std::allocator<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_node;
  ppuVar6 = (this->apps).m_obj.
            super__Deque_base<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>,_std::allocator<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>_>_>
            ._M_impl.super__Deque_impl_data._M_start._M_node;
  if ((index < 0) ||
     (puVar2 = (this->apps).m_obj.
               super__Deque_base<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>,_std::allocator<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur,
     (int)((int)((ulong)((long)(this->apps).m_obj.
                               super__Deque_base<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>,_std::allocator<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>_>_>
                               ._M_impl.super__Deque_impl_data._M_start._M_last - (long)puVar2) >> 3
                ) + (int)((ulong)((long)(this->apps).m_obj.
                                        super__Deque_base<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>,_std::allocator<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>_>_>
                                        ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                                 (long)(this->apps).m_obj.
                                       super__Deque_base<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>,_std::allocator<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>_>_>
                                       ._M_impl.super__Deque_impl_data._M_finish._M_first) >> 3) +
          ((((uint)((int)ppuVar1 - (int)ppuVar6) >> 3) - 1) + (uint)(ppuVar1 == (_Map_pointer)0x0))
          * 0x40) <= index)) goto LAB_0019c889;
  uVar8 = ((long)puVar2 -
           (long)(this->apps).m_obj.
                 super__Deque_base<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>,_std::allocator<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_first >> 3) + uVar5;
  if (uVar8 < 0x40) {
    puVar7 = puVar2 + uVar5;
  }
  else {
    uVar9 = uVar8 >> 6 | 0xfc00000000000000;
    if (0 < (long)uVar8) {
      uVar9 = uVar8 >> 6;
    }
    puVar7 = ppuVar6[uVar9] + uVar8 + uVar9 * -0x40;
  }
  ((puVar7->_M_t).super___uniq_ptr_impl<helics::AppObject,_std::default_delete<helics::AppObject>_>.
   _M_t.super__Tuple_impl<0UL,_helics::AppObject_*,_std::default_delete<helics::AppObject>_>.
   super__Head_base<0UL,_helics::AppObject_*,_false>._M_head_impl)->valid = 0;
  if (uVar8 < 0x40) {
    this_00 = (default_delete<helics::AppObject> *)(puVar2 + uVar5);
  }
  else {
    uVar5 = uVar8 >> 6 | 0xfc00000000000000;
    if (0 < (long)uVar8) {
      uVar5 = uVar8 >> 6;
    }
    this_00 = (default_delete<helics::AppObject> *)(ppuVar6[uVar5] + uVar8 + uVar5 * -0x40);
  }
  __ptr = *(AppObject **)this_00;
  *(undefined8 *)this_00 = 0;
  if (__ptr != (AppObject *)0x0) {
    std::default_delete<helics::AppObject>::operator()(this_00,__ptr);
  }
  ppuVar1 = (this->apps).m_obj.
            super__Deque_base<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>,_std::allocator<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_node;
  ppuVar6 = (this->apps).m_obj.
            super__Deque_base<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>,_std::allocator<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>_>_>
            ._M_impl.super__Deque_impl_data._M_start._M_node;
  lVar11 = (((ulong)((long)ppuVar1 - (long)ppuVar6) >> 3) - (ulong)(ppuVar1 != (_Map_pointer)0x0)) *
           0x40;
  puVar3 = (this->apps).m_obj.
           super__Deque_base<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>,_std::allocator<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  lVar10 = (long)puVar3 -
           (long)(this->apps).m_obj.
                 super__Deque_base<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>,_std::allocator<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_first >> 3;
  puVar4 = (this->apps).m_obj.
           super__Deque_base<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>,_std::allocator<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  puVar7 = (this->apps).m_obj.
           super__Deque_base<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>,_std::allocator<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_last;
  lVar12 = (long)puVar7 - (long)puVar4 >> 3;
  if ((ulong)(lVar10 + lVar12 + lVar11) < 0xb) goto LAB_0019c889;
  lVar11 = lVar11 + lVar10 + lVar12 >> 2;
  if (0 < lVar11) {
    lVar11 = lVar11 + 1;
    do {
      if ((puVar4->_M_t).
          super___uniq_ptr_impl<helics::AppObject,_std::default_delete<helics::AppObject>_>._M_t.
          super__Tuple_impl<0UL,_helics::AppObject_*,_std::default_delete<helics::AppObject>_>.
          super__Head_base<0UL,_helics::AppObject_*,_false>._M_head_impl != (AppObject *)0x0)
      goto LAB_0019c87f;
      puVar4 = puVar4 + 1;
      if (puVar4 == puVar7) {
        puVar4 = ppuVar6[1];
        ppuVar6 = ppuVar6 + 1;
        puVar7 = puVar4 + 0x40;
      }
      if ((puVar4->_M_t).
          super___uniq_ptr_impl<helics::AppObject,_std::default_delete<helics::AppObject>_>._M_t.
          super__Tuple_impl<0UL,_helics::AppObject_*,_std::default_delete<helics::AppObject>_>.
          super__Head_base<0UL,_helics::AppObject_*,_false>._M_head_impl != (AppObject *)0x0)
      goto LAB_0019c87f;
      puVar4 = puVar4 + 1;
      if (puVar4 == puVar7) {
        puVar4 = ppuVar6[1];
        ppuVar6 = ppuVar6 + 1;
        puVar7 = puVar4 + 0x40;
      }
      if ((puVar4->_M_t).
          super___uniq_ptr_impl<helics::AppObject,_std::default_delete<helics::AppObject>_>._M_t.
          super__Tuple_impl<0UL,_helics::AppObject_*,_std::default_delete<helics::AppObject>_>.
          super__Head_base<0UL,_helics::AppObject_*,_false>._M_head_impl != (AppObject *)0x0)
      goto LAB_0019c87f;
      puVar4 = puVar4 + 1;
      if (puVar4 == puVar7) {
        puVar4 = ppuVar6[1];
        ppuVar6 = ppuVar6 + 1;
        puVar7 = puVar4 + 0x40;
      }
      if ((puVar4->_M_t).
          super___uniq_ptr_impl<helics::AppObject,_std::default_delete<helics::AppObject>_>._M_t.
          super__Tuple_impl<0UL,_helics::AppObject_*,_std::default_delete<helics::AppObject>_>.
          super__Head_base<0UL,_helics::AppObject_*,_false>._M_head_impl != (AppObject *)0x0)
      goto LAB_0019c87f;
      puVar4 = puVar4 + 1;
      if (puVar4 == puVar7) {
        puVar4 = ppuVar6[1];
        ppuVar6 = ppuVar6 + 1;
        puVar7 = puVar4 + 0x40;
      }
      lVar11 = lVar11 + -1;
    } while (1 < lVar11);
  }
  lVar10 = lVar10 + (((ulong)((long)ppuVar1 - (long)ppuVar6) >> 3) -
                    (ulong)(ppuVar1 != (_Map_pointer)0x0)) * 0x40 +
           ((long)puVar7 - (long)puVar4 >> 3);
  if (lVar10 == 1) {
LAB_0019c876:
    if ((puVar4->_M_t).
        super___uniq_ptr_impl<helics::AppObject,_std::default_delete<helics::AppObject>_>._M_t.
        super__Tuple_impl<0UL,_helics::AppObject_*,_std::default_delete<helics::AppObject>_>.
        super__Head_base<0UL,_helics::AppObject_*,_false>._M_head_impl == (AppObject *)0x0) {
LAB_0019c87c:
      puVar4 = puVar3;
    }
  }
  else if (lVar10 == 2) {
LAB_0019c863:
    if ((puVar4->_M_t).
        super___uniq_ptr_impl<helics::AppObject,_std::default_delete<helics::AppObject>_>._M_t.
        super__Tuple_impl<0UL,_helics::AppObject_*,_std::default_delete<helics::AppObject>_>.
        super__Head_base<0UL,_helics::AppObject_*,_false>._M_head_impl == (AppObject *)0x0) {
      puVar4 = puVar4 + 1;
      if (puVar4 == puVar7) {
        puVar4 = ppuVar6[1];
      }
      goto LAB_0019c876;
    }
  }
  else {
    if (lVar10 != 3) goto LAB_0019c87c;
    if ((puVar4->_M_t).
        super___uniq_ptr_impl<helics::AppObject,_std::default_delete<helics::AppObject>_>._M_t.
        super__Tuple_impl<0UL,_helics::AppObject_*,_std::default_delete<helics::AppObject>_>.
        super__Head_base<0UL,_helics::AppObject_*,_false>._M_head_impl == (AppObject *)0x0) {
      puVar4 = puVar4 + 1;
      if (puVar4 == puVar7) {
        puVar4 = ppuVar6[1];
        ppuVar6 = ppuVar6 + 1;
        puVar7 = puVar4 + 0x40;
      }
      goto LAB_0019c863;
    }
  }
LAB_0019c87f:
  if (puVar3 == puVar4) {
    std::
    deque<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>,_std::allocator<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>_>_>
    ::clear(&(this->apps).m_obj);
  }
LAB_0019c889:
  std::unique_lock<std::mutex>::~unique_lock(&local_30);
  return;
}

Assistant:

void MasterObjectHolder::clearApp(int index)
{
    auto appList = apps.lock();
    if ((index < static_cast<int>(appList->size())) && (index >= 0)) {
        (*appList)[index]->valid = 0;
        (*appList)[index] = nullptr;
        if (appList->size() > 10) {
            if (std::none_of(appList->begin(), appList->end(), [](const auto& app) { return static_cast<bool>(app); })) {
                appList->clear();
            }
        }
    }
}